

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void pmxevcntr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint64_t uVar1;
  uint uVar2;
  
  uVar1 = (env->cp15).c9_pmselr;
  uVar2 = (uint)uVar1;
  if ((uVar2 & 0x1f) < ((uint)(env->cp15).c9_pmcr >> 0xb & 0x1f)) {
    pmevcntr_op_start(env,(byte)uVar1 & 0x1f);
    (env->cp15).c14_pmevcntr[uVar2 & 0x1f] = value;
  }
  return;
}

Assistant:

static void pmxevcntr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                             uint64_t value)
{
    pmevcntr_write(env, ri, value, env->cp15.c9_pmselr & 31);
}